

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O3

Value * __thiscall
duckdb::ViewColumnHelper::ColumnComment
          (Value *__return_storage_ptr__,ViewColumnHelper *this,idx_t col)

{
  ViewCatalogEntry *pVVar1;
  reference other;
  LogicalType LStack_28;
  
  pVVar1 = this->entry;
  if ((pVVar1->column_comments).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pVVar1->column_comments).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    LogicalType::LogicalType(&LStack_28,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_28);
    LogicalType::~LogicalType(&LStack_28);
  }
  else {
    other = vector<duckdb::Value,_true>::operator[](&pVVar1->column_comments,col);
    Value::Value(__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

const Value ColumnComment(idx_t col) override {
		if (entry.column_comments.empty()) {
			return Value();
		}
		D_ASSERT(entry.column_comments.size() == entry.types.size());
		return entry.column_comments[col];
	}